

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner_tests.cpp
# Opt level: O3

void __thiscall
miner_tests::MinerTestingSetup::TestPrioritisedMining
          (MinerTestingSetup *this,CScript *scriptPubKey,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *txFirst)

{
  undefined1 auVar1 [16];
  element_type *peVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  CTxMemPool *this_00;
  time_point tVar10;
  long lVar11;
  iterator in_R8;
  iterator pvVar12;
  iterator in_R9;
  iterator pvVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  CMutableTransaction tx;
  TestMemPoolEntryHelper entry;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock20;
  Txid hashFreeGrandchild;
  Txid hashFreeChild;
  Txid hashFreeParent;
  Txid hashPrioritsedChild;
  Txid hashMediumFeeTx;
  Txid hashParentTx;
  uint256 hashFreePrioritisedTx;
  char *pcVar29;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  undefined1 local_364 [20];
  char *local_350;
  undefined1 *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  undefined1 local_318 [8];
  CMutableTransaction local_310;
  undefined1 local_2d8 [16];
  uint local_2c8;
  uint64_t local_2c0;
  bool local_2b8;
  size_t local_2b4;
  undefined1 local_2a8 [16];
  CTxMemPool *local_290;
  assertion_result local_288;
  CTxMemPool **local_270;
  undefined8 *local_268;
  char *local_260;
  char *local_258;
  assertion_result local_250;
  unique_lock<std::recursive_mutex> local_238;
  Txid local_228;
  Txid local_208;
  Txid local_1e8;
  Txid local_1c8;
  Txid local_1a8;
  Txid local_188;
  undefined1 local_168 [16];
  undefined1 local_158 [12];
  uint uStack_14c;
  undefined1 local_140 [232];
  undefined8 local_58;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  uchar uStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = MakeMempool(this);
  local_238._M_device = &(this_00->cs).super_recursive_mutex;
  local_238._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_238);
  local_2d8 = (undefined1  [16])0x0;
  local_2c8 = 1;
  local_2c0 = 0;
  local_2b8 = false;
  local_2b4 = 4;
  local_2a8 = (undefined1  [16])0x0;
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)(local_318 + 8));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)(local_318 + 8),1);
  peVar2 = (((txFirst->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar4 = *(undefined8 *)&(peVar2->hash).m_wrapped;
  uVar5 = *(undefined8 *)((long)&peVar2->hash + 8);
  uVar6 = *(undefined8 *)((long)&peVar2->hash + 0x18);
  *(undefined8 *)
   ((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 0x10) =
       *(undefined8 *)((long)&peVar2->hash + 0x10);
  *(undefined8 *)
   ((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 0x18) = uVar6;
  *(undefined8 *)
   &((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped = uVar4;
  *(undefined8 *)
   ((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 8) = uVar5;
  ((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  _local_158 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             (uchar *)&local_288);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  if (0x1c < uStack_14c) {
    free((void *)local_168._0_8_);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_310.vout,1);
  (local_310.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 5000000000;
  CMutableTransaction::GetHash((Txid *)local_168,(CMutableTransaction *)(local_318 + 8));
  auVar8 = _local_158;
  auVar7 = local_168;
  local_48 = local_158[0];
  uStack_47 = local_158[1];
  uStack_46 = local_158[2];
  uStack_45 = local_158[3];
  uStack_44 = local_158[4];
  uStack_43 = local_158[5];
  uStack_42 = local_158[6];
  uStack_41 = local_158[7];
  uStack_40 = (uint64_t)stack0xfffffffffffffeb0;
  local_58 = (char *)local_168._0_8_;
  uStack_50 = local_168[8];
  uStack_4f = local_168[9];
  uStack_4e = local_168[10];
  uStack_4d = local_168[0xb];
  uStack_4c = local_168[0xc];
  uStack_4b = local_168[0xd];
  uStack_4a = local_168[0xe];
  uStack_49 = local_168[0xf];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_2d8._8_8_;
  local_2d8 = auVar1 << 0x40;
  local_168 = auVar7;
  _local_158 = auVar8;
  tVar10 = NodeClock::now();
  local_2d8._8_8_ = (long)tVar10.__d.__r / 1000000000;
  local_2b8 = true;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)local_2d8,
             (CMutableTransaction *)(local_318 + 8));
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_140 + 0x18));
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_158);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  local_168._0_8_ = (char *)0x1dcd6500;
  CTxMemPool::PrioritiseTransaction(this_00,(uint256 *)&local_58,(CAmount *)local_168);
  peVar2 = (txFirst->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar4 = *(undefined8 *)&(peVar2->hash).m_wrapped;
  uVar5 = *(undefined8 *)((long)&peVar2->hash + 8);
  uVar6 = *(undefined8 *)((long)&peVar2->hash + 0x18);
  *(undefined8 *)
   ((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 0x10) =
       *(undefined8 *)((long)&peVar2->hash + 0x10);
  *(undefined8 *)
   ((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 0x18) = uVar6;
  *(undefined8 *)
   &((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped = uVar4;
  *(undefined8 *)
   ((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 8) = uVar5;
  ((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  (local_310.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 0x12a05ee18;
  CMutableTransaction::GetHash(&local_188,(CMutableTransaction *)(local_318 + 8));
  local_2d8._0_8_ = 1000;
  tVar10 = NodeClock::now();
  local_2d8._8_8_ = (long)tVar10.__d.__r / 1000000000;
  local_2b8 = true;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)local_2d8,
             (CMutableTransaction *)(local_318 + 8));
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_140 + 0x18));
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_158);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  peVar2 = (txFirst->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar4 = *(undefined8 *)&(peVar2->hash).m_wrapped;
  uVar5 = *(undefined8 *)((long)&peVar2->hash + 8);
  uVar6 = *(undefined8 *)((long)&peVar2->hash + 0x18);
  *(undefined8 *)
   ((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 0x10) =
       *(undefined8 *)((long)&peVar2->hash + 0x10);
  *(undefined8 *)
   ((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 0x18) = uVar6;
  *(undefined8 *)
   &((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped = uVar4;
  *(undefined8 *)
   ((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 8) = uVar5;
  (local_310.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 0x12a05caf0;
  CMutableTransaction::GetHash(&local_1a8,(CMutableTransaction *)(local_318 + 8));
  local_2d8._0_8_ = 10000;
  tVar10 = NodeClock::now();
  local_2d8._8_8_ = (long)tVar10.__d.__r / 1000000000;
  local_2b8 = true;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)local_2d8,
             (CMutableTransaction *)(local_318 + 8));
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_140 + 0x18));
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_158);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  local_168._0_8_ = (char *)0xffffffffe2329b00;
  CTxMemPool::PrioritiseTransaction(this_00,&local_1a8.m_wrapped,(CAmount *)local_168);
  *(ulong *)((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 0x10) =
       CONCAT17(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17],
                CONCAT16(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16],
                         CONCAT15(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15],
                                  CONCAT14(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems
                                           [0x14],CONCAT13(local_188.m_wrapped.super_base_blob<256U>
                                                           .m_data._M_elems[0x13],
                                                           CONCAT12(local_188.m_wrapped.
                                                                    super_base_blob<256U>.m_data.
                                                                    _M_elems[0x12],
                                                                    CONCAT11(local_188.m_wrapped.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0x11],
                                                                             local_188.m_wrapped.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0x10]))
                                                          )))));
  *(ulong *)((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 0x18) =
       CONCAT17(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f],
                CONCAT16(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e],
                         CONCAT15(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d],
                                  CONCAT14(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems
                                           [0x1c],CONCAT13(local_188.m_wrapped.super_base_blob<256U>
                                                           .m_data._M_elems[0x1b],
                                                           CONCAT12(local_188.m_wrapped.
                                                                    super_base_blob<256U>.m_data.
                                                                    _M_elems[0x1a],
                                                                    CONCAT11(local_188.m_wrapped.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0x19],
                                                                             local_188.m_wrapped.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0x18]))
                                                          )))));
  *(ulong *)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped =
       CONCAT17(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[7],
                CONCAT16(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[6],
                         CONCAT15(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[5],
                                  CONCAT14(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems
                                           [4],CONCAT13(local_188.m_wrapped.super_base_blob<256U>.
                                                        m_data._M_elems[3],
                                                        CONCAT12(local_188.m_wrapped.
                                                                 super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(local_188.m_wrapped.
                                                                          super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          local_188.m_wrapped.
                                                                          super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  *(ulong *)((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 8) =
       CONCAT17(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf],
                CONCAT16(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe],
                         CONCAT15(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd],
                                  CONCAT14(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems
                                           [0xc],CONCAT13(local_188.m_wrapped.super_base_blob<256U>.
                                                          m_data._M_elems[0xb],
                                                          CONCAT12(local_188.m_wrapped.
                                                                   super_base_blob<256U>.m_data.
                                                                   _M_elems[10],
                                                                   CONCAT11(local_188.m_wrapped.
                                                                            super_base_blob<256U>.
                                                                            m_data._M_elems[9],
                                                                            local_188.m_wrapped.
                                                                            super_base_blob<256U>.
                                                                            m_data._M_elems[8]))))))
               );
  (local_310.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 0x12a05ea30;
  CMutableTransaction::GetHash(&local_1c8,(CMutableTransaction *)(local_318 + 8));
  local_2d8._0_8_ = 1000;
  tVar10 = NodeClock::now();
  local_2d8._8_8_ = (long)tVar10.__d.__r / 1000000000;
  local_2b8 = false;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)local_2d8,
             (CMutableTransaction *)(local_318 + 8));
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_140 + 0x18));
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_158);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  local_168._0_8_ = (char *)0xbebc200;
  CTxMemPool::PrioritiseTransaction(this_00,&local_1c8.m_wrapped,(CAmount *)local_168);
  peVar2 = (txFirst->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start[3].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar4 = *(undefined8 *)&(peVar2->hash).m_wrapped;
  uVar5 = *(undefined8 *)((long)&peVar2->hash + 8);
  uVar6 = *(undefined8 *)((long)&peVar2->hash + 0x18);
  *(undefined8 *)
   ((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 0x10) =
       *(undefined8 *)((long)&peVar2->hash + 0x10);
  *(undefined8 *)
   ((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 0x18) = uVar6;
  *(undefined8 *)
   &((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped = uVar4;
  *(undefined8 *)
   ((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 8) = uVar5;
  (local_310.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 5000000000;
  CMutableTransaction::GetHash(&local_1e8,(CMutableTransaction *)(local_318 + 8));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_2d8._8_8_;
  local_2d8 = auVar7 << 0x40;
  local_2b8 = true;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)local_2d8,
             (CMutableTransaction *)(local_318 + 8));
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_140 + 0x18));
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_158);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  local_168._0_8_ = (char *)0x3b9aca00;
  CTxMemPool::PrioritiseTransaction(this_00,&local_1e8.m_wrapped,(CAmount *)local_168);
  *(ulong *)((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 0x10) =
       CONCAT17(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17],
                CONCAT16(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16],
                         CONCAT15(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15],
                                  CONCAT14(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems
                                           [0x14],CONCAT13(local_1e8.m_wrapped.super_base_blob<256U>
                                                           .m_data._M_elems[0x13],
                                                           CONCAT12(local_1e8.m_wrapped.
                                                                    super_base_blob<256U>.m_data.
                                                                    _M_elems[0x12],
                                                                    CONCAT11(local_1e8.m_wrapped.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0x11],
                                                                             local_1e8.m_wrapped.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0x10]))
                                                          )))));
  *(ulong *)((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 0x18) =
       CONCAT17(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f],
                CONCAT16(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e],
                         CONCAT15(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d],
                                  CONCAT14(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems
                                           [0x1c],CONCAT13(local_1e8.m_wrapped.super_base_blob<256U>
                                                           .m_data._M_elems[0x1b],
                                                           CONCAT12(local_1e8.m_wrapped.
                                                                    super_base_blob<256U>.m_data.
                                                                    _M_elems[0x1a],
                                                                    CONCAT11(local_1e8.m_wrapped.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0x19],
                                                                             local_1e8.m_wrapped.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0x18]))
                                                          )))));
  *(ulong *)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped =
       CONCAT17(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[7],
                CONCAT16(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[6],
                         CONCAT15(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[5],
                                  CONCAT14(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems
                                           [4],CONCAT13(local_1e8.m_wrapped.super_base_blob<256U>.
                                                        m_data._M_elems[3],
                                                        CONCAT12(local_1e8.m_wrapped.
                                                                 super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(local_1e8.m_wrapped.
                                                                          super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          local_1e8.m_wrapped.
                                                                          super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  *(ulong *)((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 8) =
       CONCAT17(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf],
                CONCAT16(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe],
                         CONCAT15(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd],
                                  CONCAT14(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems
                                           [0xc],CONCAT13(local_1e8.m_wrapped.super_base_blob<256U>.
                                                          m_data._M_elems[0xb],
                                                          CONCAT12(local_1e8.m_wrapped.
                                                                   super_base_blob<256U>.m_data.
                                                                   _M_elems[10],
                                                                   CONCAT11(local_1e8.m_wrapped.
                                                                            super_base_blob<256U>.
                                                                            m_data._M_elems[9],
                                                                            local_1e8.m_wrapped.
                                                                            super_base_blob<256U>.
                                                                            m_data._M_elems[8]))))))
               );
  (local_310.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 5000000000;
  CMutableTransaction::GetHash(&local_208,(CMutableTransaction *)(local_318 + 8));
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_2d8._8_8_;
  local_2d8 = auVar8 << 0x40;
  local_2b8 = false;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)local_2d8,
             (CMutableTransaction *)(local_318 + 8));
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_140 + 0x18));
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_158);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  local_168._0_8_ = 100000000;
  CTxMemPool::PrioritiseTransaction(this_00,&local_208.m_wrapped,(CAmount *)local_168);
  *(ulong *)((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 0x10) =
       CONCAT17(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17],
                CONCAT16(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16],
                         CONCAT15(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15],
                                  CONCAT14(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems
                                           [0x14],CONCAT13(local_208.m_wrapped.super_base_blob<256U>
                                                           .m_data._M_elems[0x13],
                                                           CONCAT12(local_208.m_wrapped.
                                                                    super_base_blob<256U>.m_data.
                                                                    _M_elems[0x12],
                                                                    CONCAT11(local_208.m_wrapped.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0x11],
                                                                             local_208.m_wrapped.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0x10]))
                                                          )))));
  *(ulong *)((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 0x18) =
       CONCAT17(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f],
                CONCAT16(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e],
                         CONCAT15(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d],
                                  CONCAT14(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems
                                           [0x1c],CONCAT13(local_208.m_wrapped.super_base_blob<256U>
                                                           .m_data._M_elems[0x1b],
                                                           CONCAT12(local_208.m_wrapped.
                                                                    super_base_blob<256U>.m_data.
                                                                    _M_elems[0x1a],
                                                                    CONCAT11(local_208.m_wrapped.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0x19],
                                                                             local_208.m_wrapped.
                                                                             super_base_blob<256U>.
                                                                             m_data._M_elems[0x18]))
                                                          )))));
  *(ulong *)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start)->prevout).hash.m_wrapped =
       CONCAT17(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[7],
                CONCAT16(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[6],
                         CONCAT15(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[5],
                                  CONCAT14(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems
                                           [4],CONCAT13(local_208.m_wrapped.super_base_blob<256U>.
                                                        m_data._M_elems[3],
                                                        CONCAT12(local_208.m_wrapped.
                                                                 super_base_blob<256U>.m_data.
                                                                 _M_elems[2],
                                                                 CONCAT11(local_208.m_wrapped.
                                                                          super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          local_208.m_wrapped.
                                                                          super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))));
  *(ulong *)((long)&((local_310.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped + 8) =
       CONCAT17(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf],
                CONCAT16(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe],
                         CONCAT15(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd],
                                  CONCAT14(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems
                                           [0xc],CONCAT13(local_208.m_wrapped.super_base_blob<256U>.
                                                          m_data._M_elems[0xb],
                                                          CONCAT12(local_208.m_wrapped.
                                                                   super_base_blob<256U>.m_data.
                                                                   _M_elems[10],
                                                                   CONCAT11(local_208.m_wrapped.
                                                                            super_base_blob<256U>.
                                                                            m_data._M_elems[9],
                                                                            local_208.m_wrapped.
                                                                            super_base_blob<256U>.
                                                                            m_data._M_elems[8]))))))
               );
  (local_310.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 5000000000;
  CMutableTransaction::GetHash(&local_228,(CMutableTransaction *)(local_318 + 8));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_2d8._8_8_;
  local_2d8 = auVar9 << 0x40;
  local_2b8 = false;
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)local_168,(TestMemPoolEntryHelper *)local_2d8,
             (CMutableTransaction *)(local_318 + 8));
  CTxMemPool::addUnchecked(this_00,(CTxMemPoolEntry *)local_168);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(local_140 + 0x18));
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)local_158);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  AssemblerForTest((BlockAssembler *)local_168,this,this_00);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_318,(CScript *)local_168);
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_140);
  if ((CBlockTemplate *)local_168._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_168,(CBlockTemplate *)local_168._0_8_);
  }
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x251;
  file.m_begin = (iterator)&local_328;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_338,msg);
  local_350 = (char *)((ulong)local_350 & 0xffffffffffffff00);
  local_364._12_8_ = &PTR__lazy_ostream_013ae088;
  local_348 = boost::unit_test::lazy_ostream::inst;
  local_340 = "";
  lVar11 = (long)*(pointer *)((long)local_318 + 0x58) -
           (long)(((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)((long)local_318 + 0x50))->
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  local_364._4_8_ = lVar11 >> 4;
  local_268 = (undefined8 *)(local_364 + 4);
  local_290 = (CTxMemPool *)local_364;
  local_250.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(lVar11 == 0x60);
  local_364._0_4_ = 6;
  local_250.m_message.px = (element_type *)0x0;
  local_250.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_258 = "";
  unique0x00005300 = &local_268;
  local_168[8] = 0;
  local_168._0_8_ = &PTR__lazy_ostream_013ae0c8;
  local_158._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_270 = &local_290;
  local_288.m_message.px = (element_type *)(local_288.m_message._1_8_ << 8);
  local_288._0_8_ = &PTR__lazy_ostream_013ae108;
  local_288.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcVar29 = "pblocktemplate->block.vtx.size()";
  pvVar12 = (iterator)0x2;
  pvVar13 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_250,(lazy_ostream *)(local_364 + 0xc),2,2,REQUIRE,0xea8ef5,(size_t)&local_260,
             0x251,(CScript *)local_168,"6U",&local_288);
  boost::detail::shared_count::~shared_count(&local_250.m_message.pn);
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x252;
  file_00.m_begin = (iterator)&local_378;
  msg_00.m_end = pvVar13;
  msg_00.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_388,
             msg_00);
  peVar2 = (((CBlock *)local_318)->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar1 = *(undefined1 (*) [16])((long)&peVar2->hash + 0x10);
  auVar23[0] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                *(uchar *)&(peVar2->hash).m_wrapped);
  auVar23[1] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                *(uchar *)((long)&peVar2->hash + 1));
  auVar23[2] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                *(uchar *)((long)&peVar2->hash + 2));
  auVar23[3] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                *(uchar *)((long)&peVar2->hash + 3));
  auVar23[4] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                *(uchar *)((long)&peVar2->hash + 4));
  auVar23[5] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                *(uchar *)((long)&peVar2->hash + 5));
  auVar23[6] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                *(uchar *)((long)&peVar2->hash + 6));
  auVar23[7] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                *(uchar *)((long)&peVar2->hash + 7));
  auVar23[8] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                *(uchar *)((long)&peVar2->hash + 8));
  auVar23[9] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                *(uchar *)((long)&peVar2->hash + 9));
  auVar23[10] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 *(uchar *)((long)&peVar2->hash + 10));
  auVar23[0xb] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  *(uchar *)((long)&peVar2->hash + 0xb));
  auVar23[0xc] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  *(uchar *)((long)&peVar2->hash + 0xc));
  auVar23[0xd] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  *(uchar *)((long)&peVar2->hash + 0xd));
  auVar23[0xe] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  *(uchar *)((long)&peVar2->hash + 0xe));
  auVar23[0xf] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  *(uchar *)((long)&peVar2->hash + 0xf));
  auVar15[0] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] == auVar1[0]);
  auVar15[1] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] == auVar1[1]);
  auVar15[2] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] == auVar1[2]);
  auVar15[3] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] == auVar1[3]);
  auVar15[4] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] == auVar1[4]);
  auVar15[5] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] == auVar1[5]);
  auVar15[6] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] == auVar1[6]);
  auVar15[7] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] == auVar1[7]);
  auVar15[8] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] == auVar1[8]);
  auVar15[9] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] == auVar1[9]);
  auVar15[10] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] == auVar1[10]);
  auVar15[0xb] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] == auVar1[0xb]);
  auVar15[0xc] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] == auVar1[0xc]);
  auVar15[0xd] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] == auVar1[0xd]);
  auVar15[0xe] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] == auVar1[0xe]);
  auVar15[0xf] = -(local_1e8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] == auVar1[0xf]);
  auVar15 = auVar15 & auVar23;
  local_288.m_message.px = (element_type *)0x0;
  local_288.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_364._12_8_ = "pblocktemplate->block.vtx[1]->GetHash() == hashFreeParent";
  local_350 = "";
  local_168[8] = 0;
  local_168._0_8_ = &PTR__lazy_ostream_013ae1c8;
  unique0x00005300 = (undefined8 **)(local_364 + 0xc);
  local_158._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_390 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff);
  boost::test_tools::tt_detail::report_assertion
            (&local_288,(lazy_ostream *)local_168,1,0,WARN,(check_type)pcVar29,(size_t)&local_398,
             0x252);
  boost::detail::shared_count::~shared_count(&local_288.m_message.pn);
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x253;
  file_01.m_begin = (iterator)&local_3a8;
  msg_01.m_end = pvVar13;
  msg_01.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3b8,
             msg_01);
  peVar2 = (((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)((long)local_318 + 0x50))->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar22[0] = -(*(uchar *)((long)&peVar2->hash + 0x10) == local_48);
  auVar22[1] = -(*(uchar *)((long)&peVar2->hash + 0x11) == uStack_47);
  auVar22[2] = -(*(uchar *)((long)&peVar2->hash + 0x12) == uStack_46);
  auVar22[3] = -(*(uchar *)((long)&peVar2->hash + 0x13) == uStack_45);
  auVar22[4] = -(*(uchar *)((long)&peVar2->hash + 0x14) == uStack_44);
  auVar22[5] = -(*(uchar *)((long)&peVar2->hash + 0x15) == uStack_43);
  auVar22[6] = -(*(uchar *)((long)&peVar2->hash + 0x16) == uStack_42);
  auVar22[7] = -(*(uchar *)((long)&peVar2->hash + 0x17) == uStack_41);
  auVar22[8] = -(*(uchar *)((long)&peVar2->hash + 0x18) == (uchar)uStack_40);
  auVar22[9] = -(*(uchar *)((long)&peVar2->hash + 0x19) == uStack_40._1_1_);
  auVar22[10] = -(*(uchar *)((long)&peVar2->hash + 0x1a) == uStack_40._2_1_);
  auVar22[0xb] = -(*(uchar *)((long)&peVar2->hash + 0x1b) == uStack_40._3_1_);
  auVar22[0xc] = -(*(uchar *)((long)&peVar2->hash + 0x1c) == uStack_40._4_1_);
  auVar22[0xd] = -(*(uchar *)((long)&peVar2->hash + 0x1d) == uStack_40._5_1_);
  auVar22[0xe] = -(*(uchar *)((long)&peVar2->hash + 0x1e) == uStack_40._6_1_);
  auVar22[0xf] = -(*(uchar *)((long)&peVar2->hash + 0x1f) == uStack_40._7_1_);
  auVar16[0] = -(*(uchar *)&(peVar2->hash).m_wrapped == (uchar)local_58);
  auVar16[1] = -(*(uchar *)((long)&peVar2->hash + 1) == local_58._1_1_);
  auVar16[2] = -(*(uchar *)((long)&peVar2->hash + 2) == local_58._2_1_);
  auVar16[3] = -(*(uchar *)((long)&peVar2->hash + 3) == local_58._3_1_);
  auVar16[4] = -(*(uchar *)((long)&peVar2->hash + 4) == local_58._4_1_);
  auVar16[5] = -(*(uchar *)((long)&peVar2->hash + 5) == local_58._5_1_);
  auVar16[6] = -(*(uchar *)((long)&peVar2->hash + 6) == local_58._6_1_);
  auVar16[7] = -(*(uchar *)((long)&peVar2->hash + 7) == local_58._7_1_);
  auVar16[8] = -(*(uchar *)((long)&peVar2->hash + 8) == uStack_50);
  auVar16[9] = -(*(uchar *)((long)&peVar2->hash + 9) == uStack_4f);
  auVar16[10] = -(*(uchar *)((long)&peVar2->hash + 10) == uStack_4e);
  auVar16[0xb] = -(*(uchar *)((long)&peVar2->hash + 0xb) == uStack_4d);
  auVar16[0xc] = -(*(uchar *)((long)&peVar2->hash + 0xc) == uStack_4c);
  auVar16[0xd] = -(*(uchar *)((long)&peVar2->hash + 0xd) == uStack_4b);
  auVar16[0xe] = -(*(uchar *)((long)&peVar2->hash + 0xe) == uStack_4a);
  auVar16[0xf] = -(*(uchar *)((long)&peVar2->hash + 0xf) == uStack_49);
  auVar16 = auVar16 & auVar22;
  local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff);
  local_288.m_message.px = (element_type *)0x0;
  local_288.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_364._12_8_ = "pblocktemplate->block.vtx[2]->GetHash() == hashFreePrioritisedTx";
  local_350 = "";
  local_168[8] = 0;
  local_168._0_8_ = &PTR__lazy_ostream_013ae1c8;
  unique0x00005300 = (undefined8 **)(local_364 + 0xc);
  local_158._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_3c0 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_288,(lazy_ostream *)local_168,1,0,WARN,(check_type)pcVar29,(size_t)&local_3c8,
             0x253);
  boost::detail::shared_count::~shared_count(&local_288.m_message.pn);
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x254;
  file_02.m_begin = (iterator)&local_3d8;
  msg_02.m_end = pvVar13;
  msg_02.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3e8,
             msg_02);
  peVar2 = (((CBlock *)local_318)->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[3].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar1 = *(undefined1 (*) [16])((long)&peVar2->hash + 0x10);
  auVar24[0] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                *(uchar *)&(peVar2->hash).m_wrapped);
  auVar24[1] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                *(uchar *)((long)&peVar2->hash + 1));
  auVar24[2] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                *(uchar *)((long)&peVar2->hash + 2));
  auVar24[3] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                *(uchar *)((long)&peVar2->hash + 3));
  auVar24[4] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                *(uchar *)((long)&peVar2->hash + 4));
  auVar24[5] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                *(uchar *)((long)&peVar2->hash + 5));
  auVar24[6] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                *(uchar *)((long)&peVar2->hash + 6));
  auVar24[7] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                *(uchar *)((long)&peVar2->hash + 7));
  auVar24[8] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                *(uchar *)((long)&peVar2->hash + 8));
  auVar24[9] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                *(uchar *)((long)&peVar2->hash + 9));
  auVar24[10] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 *(uchar *)((long)&peVar2->hash + 10));
  auVar24[0xb] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  *(uchar *)((long)&peVar2->hash + 0xb));
  auVar24[0xc] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  *(uchar *)((long)&peVar2->hash + 0xc));
  auVar24[0xd] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  *(uchar *)((long)&peVar2->hash + 0xd));
  auVar24[0xe] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  *(uchar *)((long)&peVar2->hash + 0xe));
  auVar24[0xf] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  *(uchar *)((long)&peVar2->hash + 0xf));
  auVar17[0] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] == auVar1[0]);
  auVar17[1] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] == auVar1[1]);
  auVar17[2] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] == auVar1[2]);
  auVar17[3] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] == auVar1[3]);
  auVar17[4] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] == auVar1[4]);
  auVar17[5] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] == auVar1[5]);
  auVar17[6] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] == auVar1[6]);
  auVar17[7] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] == auVar1[7]);
  auVar17[8] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] == auVar1[8]);
  auVar17[9] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] == auVar1[9]);
  auVar17[10] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] == auVar1[10]);
  auVar17[0xb] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] == auVar1[0xb]);
  auVar17[0xc] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] == auVar1[0xc]);
  auVar17[0xd] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] == auVar1[0xd]);
  auVar17[0xe] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] == auVar1[0xe]);
  auVar17[0xf] = -(local_188.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] == auVar1[0xf]);
  auVar17 = auVar17 & auVar24;
  local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff);
  local_288.m_message.px = (element_type *)0x0;
  local_288.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_364._12_8_ = "pblocktemplate->block.vtx[3]->GetHash() == hashParentTx";
  local_350 = "";
  local_168[8] = 0;
  local_168._0_8_ = &PTR__lazy_ostream_013ae1c8;
  unique0x00005300 = (undefined8 **)(local_364 + 0xc);
  local_158._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_3f0 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_288,(lazy_ostream *)local_168,1,0,WARN,(check_type)pcVar29,(size_t)&local_3f8,
             0x254);
  boost::detail::shared_count::~shared_count(&local_288.m_message.pn);
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x255;
  file_03.m_begin = (iterator)&local_408;
  msg_03.m_end = pvVar13;
  msg_03.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_418,
             msg_03);
  peVar2 = (((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)((long)local_318 + 0x50))->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start[4].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar1 = *(undefined1 (*) [16])((long)&peVar2->hash + 0x10);
  auVar25[0] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                *(uchar *)&(peVar2->hash).m_wrapped);
  auVar25[1] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                *(uchar *)((long)&peVar2->hash + 1));
  auVar25[2] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                *(uchar *)((long)&peVar2->hash + 2));
  auVar25[3] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                *(uchar *)((long)&peVar2->hash + 3));
  auVar25[4] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                *(uchar *)((long)&peVar2->hash + 4));
  auVar25[5] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                *(uchar *)((long)&peVar2->hash + 5));
  auVar25[6] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                *(uchar *)((long)&peVar2->hash + 6));
  auVar25[7] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                *(uchar *)((long)&peVar2->hash + 7));
  auVar25[8] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                *(uchar *)((long)&peVar2->hash + 8));
  auVar25[9] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                *(uchar *)((long)&peVar2->hash + 9));
  auVar25[10] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 *(uchar *)((long)&peVar2->hash + 10));
  auVar25[0xb] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  *(uchar *)((long)&peVar2->hash + 0xb));
  auVar25[0xc] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  *(uchar *)((long)&peVar2->hash + 0xc));
  auVar25[0xd] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  *(uchar *)((long)&peVar2->hash + 0xd));
  auVar25[0xe] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  *(uchar *)((long)&peVar2->hash + 0xe));
  auVar25[0xf] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  *(uchar *)((long)&peVar2->hash + 0xf));
  auVar18[0] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] == auVar1[0]);
  auVar18[1] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] == auVar1[1]);
  auVar18[2] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] == auVar1[2]);
  auVar18[3] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] == auVar1[3]);
  auVar18[4] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] == auVar1[4]);
  auVar18[5] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] == auVar1[5]);
  auVar18[6] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] == auVar1[6]);
  auVar18[7] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] == auVar1[7]);
  auVar18[8] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] == auVar1[8]);
  auVar18[9] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] == auVar1[9]);
  auVar18[10] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] == auVar1[10]);
  auVar18[0xb] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] == auVar1[0xb]);
  auVar18[0xc] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] == auVar1[0xc]);
  auVar18[0xd] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] == auVar1[0xd]);
  auVar18[0xe] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] == auVar1[0xe]);
  auVar18[0xf] = -(local_1c8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] == auVar1[0xf]);
  auVar18 = auVar18 & auVar25;
  local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff);
  local_288.m_message.px = (element_type *)0x0;
  local_288.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_364._12_8_ = "pblocktemplate->block.vtx[4]->GetHash() == hashPrioritsedChild";
  local_350 = "";
  local_168[8] = 0;
  local_168._0_8_ = &PTR__lazy_ostream_013ae1c8;
  unique0x00005300 = (undefined8 **)(local_364 + 0xc);
  local_158._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_420 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_288,(lazy_ostream *)local_168,1,0,WARN,(check_type)pcVar29,(size_t)&local_428,
             0x255);
  boost::detail::shared_count::~shared_count(&local_288.m_message.pn);
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x256;
  file_04.m_begin = (iterator)&local_438;
  msg_04.m_end = pvVar13;
  msg_04.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_448,
             msg_04);
  peVar2 = (((CBlock *)local_318)->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar1 = *(undefined1 (*) [16])((long)&peVar2->hash + 0x10);
  auVar26[0] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                *(uchar *)&(peVar2->hash).m_wrapped);
  auVar26[1] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                *(uchar *)((long)&peVar2->hash + 1));
  auVar26[2] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                *(uchar *)((long)&peVar2->hash + 2));
  auVar26[3] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                *(uchar *)((long)&peVar2->hash + 3));
  auVar26[4] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                *(uchar *)((long)&peVar2->hash + 4));
  auVar26[5] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                *(uchar *)((long)&peVar2->hash + 5));
  auVar26[6] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                *(uchar *)((long)&peVar2->hash + 6));
  auVar26[7] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                *(uchar *)((long)&peVar2->hash + 7));
  auVar26[8] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                *(uchar *)((long)&peVar2->hash + 8));
  auVar26[9] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                *(uchar *)((long)&peVar2->hash + 9));
  auVar26[10] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 *(uchar *)((long)&peVar2->hash + 10));
  auVar26[0xb] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  *(uchar *)((long)&peVar2->hash + 0xb));
  auVar26[0xc] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  *(uchar *)((long)&peVar2->hash + 0xc));
  auVar26[0xd] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  *(uchar *)((long)&peVar2->hash + 0xd));
  auVar26[0xe] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  *(uchar *)((long)&peVar2->hash + 0xe));
  auVar26[0xf] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  *(uchar *)((long)&peVar2->hash + 0xf));
  auVar19[0] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] == auVar1[0]);
  auVar19[1] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] == auVar1[1]);
  auVar19[2] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] == auVar1[2]);
  auVar19[3] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] == auVar1[3]);
  auVar19[4] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] == auVar1[4]);
  auVar19[5] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] == auVar1[5]);
  auVar19[6] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] == auVar1[6]);
  auVar19[7] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] == auVar1[7]);
  auVar19[8] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] == auVar1[8]);
  auVar19[9] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] == auVar1[9]);
  auVar19[10] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] == auVar1[10]);
  auVar19[0xb] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] == auVar1[0xb]);
  auVar19[0xc] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] == auVar1[0xc]);
  auVar19[0xd] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] == auVar1[0xd]);
  auVar19[0xe] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] == auVar1[0xe]);
  auVar19[0xf] = -(local_208.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] == auVar1[0xf]);
  auVar19 = auVar19 & auVar26;
  local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff);
  local_288.m_message.px = (element_type *)0x0;
  local_288.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_364._12_8_ = "pblocktemplate->block.vtx[5]->GetHash() == hashFreeChild";
  local_350 = "";
  local_168[8] = 0;
  local_168._0_8_ = &PTR__lazy_ostream_013ae1c8;
  stack0xfffffffffffffeb0 = (undefined8 **)(local_364 + 0xc);
  local_158._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp";
  local_450 = "";
  pvVar12 = (iterator)0x1;
  pvVar13 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_288,(lazy_ostream *)local_168,1,0,WARN,(check_type)pcVar29,(size_t)&local_458,
             0x256);
  boost::detail::shared_count::~shared_count(&local_288.m_message.pn);
  if ((((CBlock *)local_318)->vtx).
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (((CBlock *)local_318)->vtx).
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar11 = 0;
    uVar14 = 0;
    do {
      local_468 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_460 = "";
      local_478 = &boost::unit_test::basic_cstring<char_const>::null;
      local_470 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = (iterator)0x259;
      file_05.m_begin = (iterator)&local_468;
      msg_05.m_end = pvVar13;
      msg_05.m_begin = pvVar12;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_478,
                 msg_05);
      lVar3 = *(long *)((long)&(((((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                    *)((long)local_318 + 0x50))->
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar11);
      auVar1 = *(undefined1 (*) [16])(lVar3 + 0x49);
      auVar27[0] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                    *(uchar *)(lVar3 + 0x39));
      auVar27[1] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                    *(uchar *)(lVar3 + 0x3a));
      auVar27[2] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                    *(uchar *)(lVar3 + 0x3b));
      auVar27[3] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                    *(uchar *)(lVar3 + 0x3c));
      auVar27[4] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                    *(uchar *)(lVar3 + 0x3d));
      auVar27[5] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                    *(uchar *)(lVar3 + 0x3e));
      auVar27[6] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                    *(uchar *)(lVar3 + 0x3f));
      auVar27[7] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                    *(uchar *)(lVar3 + 0x40));
      auVar27[8] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                    *(uchar *)(lVar3 + 0x41));
      auVar27[9] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                    *(uchar *)(lVar3 + 0x42));
      auVar27[10] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                     *(uchar *)(lVar3 + 0x43));
      auVar27[0xb] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                      *(uchar *)(lVar3 + 0x44));
      auVar27[0xc] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                      *(uchar *)(lVar3 + 0x45));
      auVar27[0xd] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                      *(uchar *)(lVar3 + 0x46));
      auVar27[0xe] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                      *(uchar *)(lVar3 + 0x47));
      auVar27[0xf] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                      *(uchar *)(lVar3 + 0x48));
      auVar20[0] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] == auVar1[0]);
      auVar20[1] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] == auVar1[1]);
      auVar20[2] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] == auVar1[2]);
      auVar20[3] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] == auVar1[3]);
      auVar20[4] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] == auVar1[4]);
      auVar20[5] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] == auVar1[5]);
      auVar20[6] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] == auVar1[6]);
      auVar20[7] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] == auVar1[7]);
      auVar20[8] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] == auVar1[8]);
      auVar20[9] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] == auVar1[9]);
      auVar20[10] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] == auVar1[10])
      ;
      auVar20[0xb] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                      auVar1[0xb]);
      auVar20[0xc] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                      auVar1[0xc]);
      auVar20[0xd] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                      auVar1[0xd]);
      auVar20[0xe] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                      auVar1[0xe]);
      auVar20[0xf] = -(local_228.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                      auVar1[0xf]);
      auVar20 = auVar20 & auVar27;
      local_288.m_message.px = (element_type *)0x0;
      local_288.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_364._12_8_ = "pblocktemplate->block.vtx[i]->GetHash() != hashFreeGrandchild";
      local_350 = "";
      local_168[8] = 0;
      local_168._0_8_ = &PTR__lazy_ostream_013ae1c8;
      unique0x00005300 = (undefined8 **)(local_364 + 0xc);
      local_158._0_8_ = boost::unit_test::lazy_ostream::inst;
      local_488 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_480 = "";
      pvVar12 = (iterator)0x1;
      pvVar13 = (iterator)0x0;
      local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (readonly_property<bool>)
           ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) != 0xffff);
      boost::test_tools::tt_detail::report_assertion
                (&local_288,(lazy_ostream *)local_168,1,0,WARN,(check_type)pcVar29,
                 (size_t)&local_488,0x259);
      boost::detail::shared_count::~shared_count(&local_288.m_message.pn);
      local_498 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_490 = "";
      local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0x25b;
      file_06.m_begin = (iterator)&local_498;
      msg_06.m_end = pvVar13;
      msg_06.m_begin = pvVar12;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4a8,
                 msg_06);
      lVar3 = *(long *)((long)&(((((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                    *)((long)local_318 + 0x50))->
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar11);
      auVar1 = *(undefined1 (*) [16])(lVar3 + 0x49);
      auVar28[0] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                    *(uchar *)(lVar3 + 0x39));
      auVar28[1] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                    *(uchar *)(lVar3 + 0x3a));
      auVar28[2] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                    *(uchar *)(lVar3 + 0x3b));
      auVar28[3] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                    *(uchar *)(lVar3 + 0x3c));
      auVar28[4] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                    *(uchar *)(lVar3 + 0x3d));
      auVar28[5] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                    *(uchar *)(lVar3 + 0x3e));
      auVar28[6] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                    *(uchar *)(lVar3 + 0x3f));
      auVar28[7] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                    *(uchar *)(lVar3 + 0x40));
      auVar28[8] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                    *(uchar *)(lVar3 + 0x41));
      auVar28[9] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                    *(uchar *)(lVar3 + 0x42));
      auVar28[10] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                     *(uchar *)(lVar3 + 0x43));
      auVar28[0xb] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                      *(uchar *)(lVar3 + 0x44));
      auVar28[0xc] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                      *(uchar *)(lVar3 + 0x45));
      auVar28[0xd] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                      *(uchar *)(lVar3 + 0x46));
      auVar28[0xe] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                      *(uchar *)(lVar3 + 0x47));
      auVar28[0xf] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                      *(uchar *)(lVar3 + 0x48));
      auVar21[0] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] == auVar1[0]);
      auVar21[1] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] == auVar1[1]);
      auVar21[2] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] == auVar1[2]);
      auVar21[3] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] == auVar1[3]);
      auVar21[4] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] == auVar1[4]);
      auVar21[5] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] == auVar1[5]);
      auVar21[6] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] == auVar1[6]);
      auVar21[7] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] == auVar1[7]);
      auVar21[8] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] == auVar1[8]);
      auVar21[9] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] == auVar1[9]);
      auVar21[10] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] == auVar1[10])
      ;
      auVar21[0xb] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                      auVar1[0xb]);
      auVar21[0xc] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                      auVar1[0xc]);
      auVar21[0xd] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                      auVar1[0xd]);
      auVar21[0xe] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                      auVar1[0xe]);
      auVar21[0xf] = -(local_1a8.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                      auVar1[0xf]);
      auVar21 = auVar21 & auVar28;
      local_288.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (readonly_property<bool>)
           ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) != 0xffff);
      local_288.m_message.px = (element_type *)0x0;
      local_288.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_364._12_8_ = "pblocktemplate->block.vtx[i]->GetHash() != hashMediumFeeTx";
      local_350 = "";
      local_168[8] = 0;
      local_168._0_8_ = &PTR__lazy_ostream_013ae1c8;
      stack0xfffffffffffffeb0 = (undefined8 **)(local_364 + 0xc);
      local_158._0_8_ = boost::unit_test::lazy_ostream::inst;
      local_4b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
      ;
      local_4b0 = "";
      pvVar12 = (iterator)0x1;
      pvVar13 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_288,(lazy_ostream *)local_168,1,0,WARN,(check_type)pcVar29,
                 (size_t)&local_4b8,0x25b);
      boost::detail::shared_count::~shared_count(&local_288.m_message.pn);
      uVar14 = uVar14 + 1;
      lVar11 = lVar11 + 0x10;
    } while (uVar14 < (ulong)((long)*(pointer *)((long)local_318 + 0x58) -
                              (long)(((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                       *)((long)local_318 + 0x50))->
                                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  std::default_delete<node::CBlockTemplate>::operator()
            ((default_delete<node::CBlockTemplate> *)local_318,(CBlockTemplate *)local_318);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_310.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)(local_318 + 8));
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_238);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MinerTestingSetup::TestPrioritisedMining(const CScript& scriptPubKey, const std::vector<CTransactionRef>& txFirst)
{
    CTxMemPool& tx_mempool{MakeMempool()};
    LOCK(tx_mempool.cs);

    TestMemPoolEntryHelper entry;

    // Test that a tx below min fee but prioritised is included
    CMutableTransaction tx;
    tx.vin.resize(1);
    tx.vin[0].prevout.hash = txFirst[0]->GetHash();
    tx.vin[0].prevout.n = 0;
    tx.vin[0].scriptSig = CScript() << OP_1;
    tx.vout.resize(1);
    tx.vout[0].nValue = 5000000000LL; // 0 fee
    uint256 hashFreePrioritisedTx = tx.GetHash();
    tx_mempool.addUnchecked(entry.Fee(0).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
    tx_mempool.PrioritiseTransaction(hashFreePrioritisedTx, 5 * COIN);

    tx.vin[0].prevout.hash = txFirst[1]->GetHash();
    tx.vin[0].prevout.n = 0;
    tx.vout[0].nValue = 5000000000LL - 1000;
    // This tx has a low fee: 1000 satoshis
    Txid hashParentTx = tx.GetHash(); // save this txid for later use
    tx_mempool.addUnchecked(entry.Fee(1000).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));

    // This tx has a medium fee: 10000 satoshis
    tx.vin[0].prevout.hash = txFirst[2]->GetHash();
    tx.vout[0].nValue = 5000000000LL - 10000;
    Txid hashMediumFeeTx = tx.GetHash();
    tx_mempool.addUnchecked(entry.Fee(10000).Time(Now<NodeSeconds>()).SpendsCoinbase(true).FromTx(tx));
    tx_mempool.PrioritiseTransaction(hashMediumFeeTx, -5 * COIN);

    // This tx also has a low fee, but is prioritised
    tx.vin[0].prevout.hash = hashParentTx;
    tx.vout[0].nValue = 5000000000LL - 1000 - 1000; // 1000 satoshi fee
    Txid hashPrioritsedChild = tx.GetHash();
    tx_mempool.addUnchecked(entry.Fee(1000).Time(Now<NodeSeconds>()).SpendsCoinbase(false).FromTx(tx));
    tx_mempool.PrioritiseTransaction(hashPrioritsedChild, 2 * COIN);

    // Test that transaction selection properly updates ancestor fee calculations as prioritised
    // parents get included in a block. Create a transaction with two prioritised ancestors, each
    // included by itself: FreeParent <- FreeChild <- FreeGrandchild.
    // When FreeParent is added, a modified entry will be created for FreeChild + FreeGrandchild
    // FreeParent's prioritisation should not be included in that entry.
    // When FreeChild is included, FreeChild's prioritisation should also not be included.
    tx.vin[0].prevout.hash = txFirst[3]->GetHash();
    tx.vout[0].nValue = 5000000000LL; // 0 fee
    Txid hashFreeParent = tx.GetHash();
    tx_mempool.addUnchecked(entry.Fee(0).SpendsCoinbase(true).FromTx(tx));
    tx_mempool.PrioritiseTransaction(hashFreeParent, 10 * COIN);

    tx.vin[0].prevout.hash = hashFreeParent;
    tx.vout[0].nValue = 5000000000LL; // 0 fee
    Txid hashFreeChild = tx.GetHash();
    tx_mempool.addUnchecked(entry.Fee(0).SpendsCoinbase(false).FromTx(tx));
    tx_mempool.PrioritiseTransaction(hashFreeChild, 1 * COIN);

    tx.vin[0].prevout.hash = hashFreeChild;
    tx.vout[0].nValue = 5000000000LL; // 0 fee
    Txid hashFreeGrandchild = tx.GetHash();
    tx_mempool.addUnchecked(entry.Fee(0).SpendsCoinbase(false).FromTx(tx));

    auto pblocktemplate = AssemblerForTest(tx_mempool).CreateNewBlock(scriptPubKey);
    BOOST_REQUIRE_EQUAL(pblocktemplate->block.vtx.size(), 6U);
    BOOST_CHECK(pblocktemplate->block.vtx[1]->GetHash() == hashFreeParent);
    BOOST_CHECK(pblocktemplate->block.vtx[2]->GetHash() == hashFreePrioritisedTx);
    BOOST_CHECK(pblocktemplate->block.vtx[3]->GetHash() == hashParentTx);
    BOOST_CHECK(pblocktemplate->block.vtx[4]->GetHash() == hashPrioritsedChild);
    BOOST_CHECK(pblocktemplate->block.vtx[5]->GetHash() == hashFreeChild);
    for (size_t i=0; i<pblocktemplate->block.vtx.size(); ++i) {
        // The FreeParent and FreeChild's prioritisations should not impact the child.
        BOOST_CHECK(pblocktemplate->block.vtx[i]->GetHash() != hashFreeGrandchild);
        // De-prioritised transaction should not be included.
        BOOST_CHECK(pblocktemplate->block.vtx[i]->GetHash() != hashMediumFeeTx);
    }
}